

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVStreambuf.cxx
# Opt level: O3

int testUVStreambuf(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  if (argc < 2) {
    pcVar3 = "Invalid arguments.\n";
    lVar2 = 0x13;
  }
  else {
    bVar1 = testUVStreambufRead(writeDataToStreamPipe,argv[1]);
    if (bVar1) {
      bVar1 = testUVStreambufRead(writeDataToStreamProcess,argv[1]);
      if (bVar1) {
        return 0;
      }
      pcVar3 = "While executing testUVStreambufRead() with process.\n";
      lVar2 = 0x34;
    }
    else {
      pcVar3 = "While executing testUVStreambufRead() with pipe.\n";
      lVar2 = 0x31;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  return -1;
}

Assistant:

int testUVStreambuf(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  if (!testUVStreambufRead(writeDataToStreamPipe, argv[1])) {
    std::cout << "While executing testUVStreambufRead() with pipe.\n";
    return -1;
  }

  if (!testUVStreambufRead(writeDataToStreamProcess, argv[1])) {
    std::cout << "While executing testUVStreambufRead() with process.\n";
    return -1;
  }

  return 0;
}